

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  uint8_t uVar7;
  StrHash h;
  int iVar8;
  GCstr *pGVar9;
  uint64_t uVar10;
  uint uVar11;
  GCstr *pGVar12;
  MSize len;
  
  uVar4 = (L->glref).ptr64;
  if (lenx - 1 < 0x7ffffeff) {
    uVar10 = *(uint64_t *)(uVar4 + 0xb0);
    len = (MSize)lenx;
    h = hash_sparse(uVar10,str,len);
    lVar5 = *(long *)(uVar4 + 0x98);
    uVar3 = *(uint *)(uVar4 + 0xa0);
    pGVar9 = *(GCstr **)(lVar5 + (ulong)(h & uVar3) * 8);
    uVar11 = 0;
    if (((ulong)pGVar9 & 1) == 0) {
      uVar7 = '\0';
      pGVar12 = pGVar9;
      uVar11 = 0;
    }
    else {
      h = hash_dense(uVar10,h,str,len);
      pGVar12 = (GCstr *)(*(ulong *)(lVar5 + (ulong)(uVar3 & h) * 8) & 0xfffffffffffffffe);
      uVar7 = '\x01';
    }
    for (; pGVar12 != (GCstr *)0x0; pGVar12 = (GCstr *)(pGVar12->nextgc).gcptr64) {
      if ((pGVar12->hash == h) && (pGVar12->len == len)) {
        iVar8 = bcmp(str,pGVar12 + 1,lenx);
        if (iVar8 == 0) {
          if ((~*(byte *)(uVar4 + 0x20) & pGVar12->marked & 3) == 0) {
            return pGVar12;
          }
          pGVar12->marked = pGVar12->marked ^ 3;
          return pGVar12;
        }
        uVar11 = uVar11 + 1;
      }
      uVar11 = uVar11 + 1;
    }
    if ((0x20 < uVar11) && (((ulong)pGVar9 & 1) == 0)) {
      pGVar9 = lj_str_rehash_chain(L,h,str,len);
      return pGVar9;
    }
    pGVar9 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)(len & 0x7ffffffc) + 0x1c);
    uVar4 = (L->glref).ptr64;
    pGVar9->marked = *(byte *)(uVar4 + 0x20) & 3;
    pGVar9->gct = '\x04';
    pGVar9->len = len;
    pGVar9->hash = h;
    pcVar1 = (char *)(uVar4 + 0xac);
    cVar2 = *pcVar1;
    *pcVar1 = *pcVar1 + -1;
    if (cVar2 == '\0') {
      uVar10 = lj_prng_u64((PRNGState *)(uVar4 + 0x188));
      *(char *)(uVar4 + 0xac) = (char)(uVar10 >> 0x38);
    }
    else {
      uVar10 = (uint64_t)*(uint *)(uVar4 + 0xa8);
    }
    *(StrID *)(uVar4 + 0xa8) = (StrID)uVar10 + 1;
    pGVar9->sid = (StrID)uVar10;
    pGVar9->reserved = '\0';
    pGVar9->hashalg = uVar7;
    *(undefined4 *)((long)&pGVar9[1].nextgc.gcptr64 + (ulong)(len & 0x7ffffffc)) = 0;
    memcpy(pGVar9 + 1,str,lenx);
    uVar3 = *(uint *)(uVar4 + 0xa0);
    lVar5 = *(long *)(uVar4 + 0x98);
    uVar6 = *(ulong *)(lVar5 + (ulong)(h & uVar3) * 8);
    (pGVar9->nextgc).gcptr64 = uVar6 & 0xfffffffffffffffe;
    *(ulong *)(lVar5 + (ulong)(h & uVar3) * 8) = (ulong)((uint)uVar6 & 1) | (ulong)pGVar9;
    uVar11 = *(uint *)(uVar4 + 0xa4);
    *(uint *)(uVar4 + 0xa4) = uVar11 + 1;
    if (uVar3 < uVar11) {
      lj_str_resize(L,uVar3 * 2 + 1);
    }
  }
  else {
    if (lenx != 0) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    pGVar9 = (GCstr *)(uVar4 + 0x78);
  }
  return pGVar9;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}